

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

double get_sr_decay_rate(FIRSTPASS_STATS *frame)

{
  double dVar1;
  double local_48;
  double local_40;
  double sr_diff_part;
  double modified_pcnt_intra;
  double modified_pct_inter;
  double sr_decay;
  double sr_diff;
  FIRSTPASS_STATS *frame_local;
  
  dVar1 = frame->sr_coded_error - frame->coded_error;
  sr_decay = 1.0;
  modified_pct_inter = frame->pcnt_inter;
  if (0.01 < frame->coded_error) {
    if (0.0 < frame->coded_error || frame->coded_error == 0.0) {
      local_40 = frame->coded_error + 1e-06;
    }
    else {
      local_40 = frame->coded_error - 1e-06;
    }
    if (frame->intra_error / local_40 < 5.0) {
      modified_pct_inter = frame->pcnt_inter - frame->pcnt_neutral;
    }
  }
  if (0.01 < dVar1) {
    sr_decay = (1.0 - modified_pct_inter) * 100.0 * -0.005 +
               (1.0 - (dVar1 * 0.25) / frame->intra_error);
  }
  if (sr_decay <= 0.75) {
    local_48 = 0.75;
  }
  else {
    local_48 = sr_decay;
  }
  return local_48;
}

Assistant:

static double get_sr_decay_rate(const FIRSTPASS_STATS *frame) {
  double sr_diff = (frame->sr_coded_error - frame->coded_error);
  double sr_decay = 1.0;
  double modified_pct_inter;
  double modified_pcnt_intra;

  modified_pct_inter = frame->pcnt_inter;
  if ((frame->coded_error > LOW_CODED_ERR_PER_MB) &&
      ((frame->intra_error / DOUBLE_DIVIDE_CHECK(frame->coded_error)) <
       (double)NCOUNT_FRAME_II_THRESH)) {
    modified_pct_inter = frame->pcnt_inter - frame->pcnt_neutral;
  }
  modified_pcnt_intra = 100 * (1.0 - modified_pct_inter);

  if ((sr_diff > LOW_SR_DIFF_TRHESH)) {
    double sr_diff_part = ((sr_diff * 0.25) / frame->intra_error);
    sr_decay = 1.0 - sr_diff_part - (INTRA_PART * modified_pcnt_intra);
  }
  return AOMMAX(sr_decay, DEFAULT_DECAY_LIMIT);
}